

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O1

void __thiscall
QGLXContext::QGLXContext
          (QGLXContext *this,Display *display,QXcbScreen *screen,QSurfaceFormat *format,
          QPlatformOpenGLContext *share)

{
  QSurfaceFormat *this_00;
  undefined4 uVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  GLXFBConfig config;
  char *pcVar8;
  qsizetype qVar9;
  qsizetype qVar10;
  qsizetype qVar11;
  qsizetype qVar12;
  XVisualInfo *visualInfo;
  Window WVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  pointer piVar17;
  RenderableType RVar18;
  uint uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  code *local_108;
  QArrayDataPointer<QByteArray> local_c8;
  QList<int> local_a8;
  QList<int> local_88;
  QSurfaceFormat local_70 [8];
  QList<int> local_68;
  QSurfaceFormat local_48 [12];
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformOpenGLContext::QPlatformOpenGLContext((QPlatformOpenGLContext *)this);
  *(undefined ***)this = &PTR__QGLXContext_00110f60;
  *(undefined ***)(this + 0x10) = &PTR__QGLXContext_00110fe0;
  *(Display **)(this + 0x18) = display;
  this_00 = (QSurfaceFormat *)(this + 0x38);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  QSurfaceFormat::QSurfaceFormat(this_00,format);
  *(undefined2 *)(this + 0x40) = 0x100;
  *(undefined8 *)(this + 0x48) = 0;
  this[0x50] = (QGLXContext)0x0;
  iVar5 = QSurfaceFormat::renderableType();
  RVar18 = (RenderableType)this_00;
  if (iVar5 == 0) {
    QOpenGLContext::openGLModuleType();
    QSurfaceFormat::setRenderableType(RVar18);
  }
  iVar5 = QSurfaceFormat::renderableType();
  if ((iVar5 == 1) || (iVar5 = QSurfaceFormat::renderableType(), iVar5 == 2)) {
    if (share != (QPlatformOpenGLContext *)0x0) {
      *(undefined8 *)(this + 0x30) = *(undefined8 *)(share + 0x28);
    }
    uVar14 = *(undefined8 *)(this + 0x18);
    uVar1 = *(undefined4 *)(*(long *)(screen + 0x20) + 0x10);
    QSurfaceFormat::QSurfaceFormat(local_48,this_00);
    config = (GLXFBConfig)qglx_findConfig(uVar14,uVar1,local_48,0,1,0);
    QSurfaceFormat::~QSurfaceFormat(local_48);
    *(GLXFBConfig *)(this + 0x20) = config;
    if (config == (GLXFBConfig)0x0) {
      iVar5 = QSurfaceFormat::renderableType();
      if (iVar5 == 2) goto LAB_0010a054;
      visualInfo = (XVisualInfo *)
                   qglx_findVisualInfo(*(_XDisplay **)(this + 0x18),
                                       *(int *)(*(long *)(screen + 0x20) + 0x10),this_00,1,0);
      if (visualInfo == (XVisualInfo *)0x0) {
        QGLXContext((QGLXContext *)&local_c8);
        goto LAB_0010a67e;
      }
      lVar16 = glXCreateContext(*(undefined8 *)(this + 0x18),visualInfo,*(undefined8 *)(this + 0x30)
                                ,1);
      *(long *)(this + 0x28) = lVar16;
      if ((lVar16 == 0) && (*(long *)(this + 0x30) != 0)) {
        *(undefined8 *)(this + 0x30) = 0;
        uVar14 = glXCreateContext(*(undefined8 *)(this + 0x18),visualInfo,0,1);
        *(undefined8 *)(this + 0x28) = uVar14;
      }
      WVar13 = createDummyWindow(*(Display **)(this + 0x18),visualInfo,
                                 *(int *)(*(long *)(screen + 0x20) + 0x10),
                                 (ulong)**(uint **)(*(long *)(screen + 0x20) + 8));
      XFree(visualInfo);
    }
    else {
      local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d._0_4_ = 0xaaaaaaaa;
      local_c8.d._4_4_ = 0xaaaaaaaa;
      local_c8.ptr._0_4_ = 0xaaaaaaaa;
      local_c8.ptr._4_4_ = 0xaaaaaaaa;
      pcVar8 = (char *)glXQueryExtensionsString
                                 (*(undefined8 *)(this + 0x18),
                                  *(undefined4 *)(*(long *)(screen + 0x20) + 0x10));
      QByteArray::QByteArray((QByteArray *)&local_68,pcVar8,-1);
      QByteArray::split((char)&local_c8);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
        }
      }
      local_108 = (code *)0x0;
      qVar9 = QtPrivate::indexOf<QByteArray,char[23]>
                        ((QList<QByteArray> *)&local_c8,(char (*) [23])"GLX_ARB_create_context",0);
      if (qVar9 != -1) {
        local_108 = (code *)glXGetProcAddress("glXCreateContextAttribsARB");
      }
      qVar9 = QtPrivate::indexOf<QByteArray,char[31]>
                        ((QList<QByteArray> *)&local_c8,
                         (char (*) [31])"GLX_ARB_create_context_profile",0);
      qVar10 = QtPrivate::indexOf<QByteArray,char[34]>
                         ((QList<QByteArray> *)&local_c8,
                          (char (*) [34])"GLX_ARB_create_context_robustness",0);
      qVar11 = QtPrivate::indexOf<QByteArray,char[37]>
                         ((QList<QByteArray> *)&local_c8,
                          (char (*) [37])"GLX_NV_robustness_video_memory_purge",0);
      if ((local_108 != (code *)0x0) &&
         ((iVar5 = QSurfaceFormat::renderableType(), iVar5 != 2 ||
          ((qVar9 != -1 &&
           (qVar12 = QtPrivate::indexOf<QByteArray,char[35]>
                               ((QList<QByteArray> *)&local_c8,
                                (char (*) [35])"GLX_EXT_create_context_es2_profile",0), qVar12 != -1
           )))))) {
        iVar6 = QSurfaceFormat::majorVersion();
        iVar7 = QSurfaceFormat::minorVersion();
        iVar5 = 9;
        if (iVar7 < 9) {
          iVar5 = iVar7;
        }
        iVar5 = iVar5 + iVar6 * 10;
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (int *)0x0;
        local_68.d.size = 0;
        iVar6 = QSurfaceFormat::renderableType();
        if (iVar6 == 1) {
          if (0x2e < iVar5) {
            local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,iVar5);
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
          }
          local_88.d.d._0_4_ = 0x2e;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x2d;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x2c;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x2b;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x2a;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x29;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x28;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x21;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x20;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x1f;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x1e;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d._0_4_ = 0x15;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
          local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,0x14);
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
          QList<int>::end(&local_68);
        }
        else {
          iVar6 = QSurfaceFormat::renderableType();
          if (iVar6 == 2) {
            if (0x20 < iVar5) {
              local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,iVar5);
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
              QList<int>::end(&local_68);
            }
            local_88.d.d._0_4_ = 0x20;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x1f;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x1e;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,0x14);
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            QSurfaceFormat::setOptions(this_00);
          }
        }
        if (share == (QPlatformOpenGLContext *)0x0) {
          cVar3 = '\0';
        }
        else {
          (**(code **)(*(long *)share + 0x18))(local_70,share);
          cVar3 = QSurfaceFormat::testOption((FormatOption)local_70);
          QSurfaceFormat::~QSurfaceFormat(local_70);
        }
        if (cVar3 != '\0') {
          QSurfaceFormat::setOption(RVar18,true);
        }
        if (*(long *)(this + 0x28) == 0) {
          uVar20 = 0;
          do {
            if ((ulong)local_68.d.size <= uVar20) break;
            piVar17 = QList<int>::data(&local_68);
            iVar6 = piVar17[uVar20];
            if (iVar6 <= iVar5) {
              local_88.d.d = (Data *)0x0;
              local_88.d.ptr = (int *)0x0;
              local_88.d.size = 0;
              local_a8.d.d._0_4_ = 0x2091;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_88,0,(int *)&local_a8);
              QList<int>::end(&local_88);
              local_a8.d.d._0_4_ = iVar6 / 10;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
              QList<int>::end(&local_88);
              local_a8.d.d._0_4_ = 0x2092;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
              QList<int>::end(&local_88);
              local_a8.d.d = (Data *)CONCAT44(local_a8.d.d._4_4_,iVar6 % 10);
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
              QList<int>::end(&local_88);
              iVar7 = QSurfaceFormat::renderableType();
              if (iVar7 == 1) {
                if ((qVar9 != -1) && (0x1f < iVar6)) {
                  iVar7 = QSurfaceFormat::profile();
                  if (iVar7 == 1) {
                    local_a8.d.d._0_4_ = 0x9126;
                    QtPrivate::QPodArrayOps<int>::emplace<int&>
                              ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
                    QList<int>::end(&local_88);
                    local_a8.d.d = (Data *)CONCAT44(local_a8.d.d._4_4_,1);
                  }
                  else {
                    local_a8.d.d._0_4_ = 0x9126;
                    QtPrivate::QPodArrayOps<int>::emplace<int&>
                              ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
                    QList<int>::end(&local_88);
                    local_a8.d.d = (Data *)CONCAT44(local_a8.d.d._4_4_,2);
                  }
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
                  QList<int>::end(&local_88);
                }
                bVar4 = QSurfaceFormat::testOption(RVar18);
                uVar19 = (uint)bVar4 | (uint)(qVar10 != -1) << 2;
                if (0x1d < iVar6) {
                  cVar3 = QSurfaceFormat::testOption(RVar18);
                  if (cVar3 == '\0') {
                    uVar19 = uVar19 | 2;
                  }
                }
                if (uVar19 != 0) {
                  local_a8.d.d._0_4_ = 0x2094;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
                  QList<int>::end(&local_88);
                  local_a8.d.d = (Data *)CONCAT44(local_a8.d.d._4_4_,uVar19);
LAB_0010a3b4:
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
                  QList<int>::end(&local_88);
                }
              }
              else {
                iVar6 = QSurfaceFormat::renderableType();
                if (iVar6 == 2) {
                  local_a8.d.d._0_4_ = 0x9126;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
                  QList<int>::end(&local_88);
                  local_a8.d.d = (Data *)CONCAT44(local_a8.d.d._4_4_,4);
                  goto LAB_0010a3b4;
                }
              }
              if ((qVar10 != -1) && (cVar3 = QSurfaceFormat::testOption(RVar18), cVar3 != '\0')) {
                local_a8.d.d = local_88.d.d;
                local_a8.d.ptr = local_88.d.ptr;
                local_a8.d.size = local_88.d.size;
                if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + 1;
                  UNLOCK();
                }
                local_3c = 0x8256;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_a8,local_88.d.size,&local_3c);
                QList<int>::end(&local_a8);
                local_3c = 0x8252;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_a8,local_a8.d.size,&local_3c);
                QList<int>::end(&local_a8);
                if (qVar11 != -1) {
                  local_3c = 0x20f7;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_a8,local_a8.d.size,&local_3c);
                  QList<int>::end(&local_a8);
                  local_3c = 1;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_a8,local_a8.d.size,&local_3c);
                  QList<int>::end(&local_a8);
                }
                local_3c = 0;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_a8,local_a8.d.size,&local_3c);
                QList<int>::end(&local_a8);
                uVar14 = *(undefined8 *)(this + 0x18);
                uVar15 = *(undefined8 *)(this + 0x30);
                piVar17 = QList<int>::data(&local_a8);
                uVar14 = (*local_108)(uVar14,config,uVar15,1,piVar17);
                *(undefined8 *)(this + 0x28) = uVar14;
                if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,4,0x10);
                  }
                }
              }
              if (*(long *)(this + 0x28) == 0) {
                local_a8.d.d = (Data *)((ulong)local_a8.d.d & 0xffffffff00000000);
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a8);
                QList<int>::end(&local_88);
                uVar14 = *(undefined8 *)(this + 0x18);
                uVar15 = *(undefined8 *)(this + 0x30);
                piVar17 = QList<int>::data(&local_88);
                lVar16 = (*local_108)(uVar14,config,uVar15,1,piVar17);
                *(long *)(this + 0x28) = lVar16;
                if ((lVar16 == 0) && (*(long *)(this + 0x30) != 0)) {
                  uVar14 = *(undefined8 *)(this + 0x18);
                  piVar17 = QList<int>::data(&local_88);
                  lVar16 = (*local_108)(uVar14,config,0,1,piVar17);
                  *(long *)(this + 0x28) = lVar16;
                  if (lVar16 != 0) {
                    *(undefined8 *)(this + 0x30) = 0;
                  }
                }
              }
              else {
                uVar14 = (**(code **)(*(long *)this + 0x60))(this);
                *(undefined8 *)(this + 0x48) = uVar14;
              }
              if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,4,0x10);
                }
              }
            }
            uVar20 = uVar20 + 1;
          } while (*(long *)(this + 0x28) == 0);
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
          }
        }
      }
      if (*(long *)(this + 0x28) == 0) {
        iVar5 = QSurfaceFormat::renderableType();
        if (iVar5 != 2) {
          lVar16 = glXCreateNewContext(*(undefined8 *)(this + 0x18),config,0x8014,
                                       *(undefined8 *)(this + 0x30),1);
          *(long *)(this + 0x28) = lVar16;
          if ((lVar16 == 0) && (*(long *)(this + 0x30) != 0)) {
            lVar16 = glXCreateNewContext(*(undefined8 *)(this + 0x18),config,0x8014,0,1);
            *(long *)(this + 0x28) = lVar16;
            if (lVar16 != 0) {
              *(undefined8 *)(this + 0x30) = 0;
            }
          }
          goto LAB_00109fbf;
        }
        bVar2 = false;
        WVar13 = 0;
      }
      else {
LAB_00109fbf:
        if (*(long *)(this + 0x28) != 0) {
          qglx_surfaceFormatFromGLXFBConfig(this_00,*(_XDisplay **)(this + 0x18),config,0);
        }
        WVar13 = createDummyWindow(*(Display **)(this + 0x18),config,
                                   *(int *)(*(long *)(screen + 0x20) + 0x10),
                                   (ulong)**(uint **)(*(long *)(screen + 0x20) + 8));
        bVar2 = true;
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_c8);
      if (!bVar2) goto LAB_0010a054;
    }
    if ((WVar13 != 0) && (*(long *)(this + 0x28) != 0)) {
      uVar14 = glXGetCurrentContext();
      uVar15 = glXGetCurrentDrawable();
      glXMakeCurrent(*(undefined8 *)(this + 0x18),WVar13,*(undefined8 *)(this + 0x28));
      updateFormatFromContext(this_00);
      glXMakeCurrent(*(undefined8 *)(this + 0x18),uVar15,uVar14);
    }
    XDestroyWindow(*(undefined8 *)(this + 0x18),WVar13);
  }
LAB_0010a054:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0010a67e:
  __stack_chk_fail();
}

Assistant:

QGLXContext::QGLXContext(Display *display, QXcbScreen *screen, const QSurfaceFormat &format, QPlatformOpenGLContext *share)
    : QPlatformOpenGLContext()
    , m_display(display)
    , m_format(format)
    , m_ownsContext(true)
{
    if (m_format.renderableType() == QSurfaceFormat::DefaultRenderableType)
        m_format.setRenderableType(QOpenGLContext::openGLModuleType() == QOpenGLContext::LibGL
                                   ? QSurfaceFormat::OpenGL : QSurfaceFormat::OpenGLES);
    if (m_format.renderableType() != QSurfaceFormat::OpenGL && m_format.renderableType() != QSurfaceFormat::OpenGLES)
        return;

    if (share)
        m_shareContext = static_cast<const QGLXContext*>(share)->glxContext();

    GLXFBConfig config = qglx_findConfig(m_display, screen->screenNumber(), m_format);
    m_config = config;
    XVisualInfo *visualInfo = nullptr;
    Window window = 0; // Temporary window used to query OpenGL context

    if (config) {
        const QByteArrayList glxExt = QByteArray(glXQueryExtensionsString(m_display, screen->screenNumber())).split(' ');

        // Resolve entry point for glXCreateContextAttribsARB
        glXCreateContextAttribsARBProc glXCreateContextAttribsARB = nullptr;
        if (glxExt.contains("GLX_ARB_create_context"))
            glXCreateContextAttribsARB = (glXCreateContextAttribsARBProc) glXGetProcAddress((const GLubyte*)"glXCreateContextAttribsARB");

        const bool supportsProfiles = glxExt.contains("GLX_ARB_create_context_profile");
        const bool supportsRobustness = glxExt.contains("GLX_ARB_create_context_robustness");
        const bool supportsVideoMemoryPurge = glxExt.contains("GLX_NV_robustness_video_memory_purge");

        // Use glXCreateContextAttribsARB if available
        // Also, GL ES context creation requires GLX_EXT_create_context_es2_profile
        if (glXCreateContextAttribsARB != nullptr
                && (m_format.renderableType() != QSurfaceFormat::OpenGLES || (supportsProfiles && glxExt.contains("GLX_EXT_create_context_es2_profile")))) {
            // Try to create an OpenGL context for each known OpenGL version in descending
            // order from the requested version.
            const int requestedVersion = m_format.majorVersion() * 10 + qMin(m_format.minorVersion(), 9);

            QList<int> glVersions;
            if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                if (requestedVersion > 46)
                    glVersions << requestedVersion;

                // Don't bother with versions below 2.0
                glVersions << 46 << 45 << 44 << 43 << 42 << 41 << 40 << 33 << 32 << 31 << 30 << 21 << 20;
            } else if (m_format.renderableType() == QSurfaceFormat::OpenGLES) {
                if (requestedVersion > 32)
                    glVersions << requestedVersion;

                // Don't bother with versions below ES 2.0
                glVersions << 32 << 31 << 30 << 20;
                // ES does not support any format option
                m_format.setOptions(QSurfaceFormat::FormatOptions());
            }
            // Robustness must match that of the shared context.
            if (share && share->format().testOption(QSurfaceFormat::ResetNotification))
                m_format.setOption(QSurfaceFormat::ResetNotification);
            Q_ASSERT(glVersions.size() > 0);

            for (int i = 0; !m_context && i < glVersions.size(); i++) {
                const int version = glVersions[i];
                if (version > requestedVersion)
                    continue;

                const int majorVersion = version / 10;
                const int minorVersion = version % 10;

                QList<int> contextAttributes;
                contextAttributes << GLX_CONTEXT_MAJOR_VERSION_ARB << majorVersion
                                  << GLX_CONTEXT_MINOR_VERSION_ARB << minorVersion;


                if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                    // If asking for OpenGL 3.2 or newer we should also specify a profile
                    if (version >= 32 && supportsProfiles) {
                        if (m_format.profile() == QSurfaceFormat::CoreProfile)
                            contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_CORE_PROFILE_BIT_ARB;
                        else
                            contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
                    }

                    int flags = 0;

                    if (supportsRobustness)
                        flags |= GLX_CONTEXT_ROBUST_ACCESS_BIT_ARB;

                    if (m_format.testOption(QSurfaceFormat::DebugContext))
                        flags |= GLX_CONTEXT_DEBUG_BIT_ARB;

                    // A forward-compatible context may be requested for 3.0 and later
                    if (version >= 30 && !m_format.testOption(QSurfaceFormat::DeprecatedFunctions))
                        flags |= GLX_CONTEXT_FORWARD_COMPATIBLE_BIT_ARB;

                    if (flags != 0)
                        contextAttributes << GLX_CONTEXT_FLAGS_ARB << flags;
                } else if (m_format.renderableType() == QSurfaceFormat::OpenGLES) {
                    contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_ES2_PROFILE_BIT_EXT;
                }

                if (supportsRobustness && m_format.testOption(QSurfaceFormat::ResetNotification)) {
                    QList<int> contextAttributesWithRobustness = contextAttributes;
                    contextAttributesWithRobustness << GLX_CONTEXT_RESET_NOTIFICATION_STRATEGY_ARB << GLX_LOSE_CONTEXT_ON_RESET_ARB;
                    if (supportsVideoMemoryPurge)
                        contextAttributesWithRobustness << GLX_GENERATE_RESET_ON_VIDEO_MEMORY_PURGE_NV << GL_TRUE;

                    contextAttributesWithRobustness << None;
                    m_context = glXCreateContextAttribsARB(m_display, config, m_shareContext, true,
                                                           contextAttributesWithRobustness.data());
                    // Context creation against a shared context may fail specifically due to this request, so try
                    // without before dropping sharing.
                }

                if (m_context) {
                    m_getGraphicsResetStatus = reinterpret_cast<GLenum (QOPENGLF_APIENTRYP)()>(getProcAddress("glGetGraphicsResetStatusARB"));
                } else {
                    contextAttributes << None;
                    m_context = glXCreateContextAttribsARB(m_display, config, m_shareContext, true, contextAttributes.data());
                    if (!m_context && m_shareContext) {
                        // re-try without a shared glx context
                        m_context = glXCreateContextAttribsARB(m_display, config, nullptr, true, contextAttributes.data());
                        if (m_context)
                            m_shareContext = nullptr;
                    }
                }
            }
        }

        // Could not create a context using glXCreateContextAttribsARB, falling back to glXCreateNewContext.
        if (!m_context) {
            // requesting an OpenGL ES context requires glXCreateContextAttribsARB, so bail out
            if (m_format.renderableType() == QSurfaceFormat::OpenGLES)
                return;

            m_context = glXCreateNewContext(m_display, config, GLX_RGBA_TYPE, m_shareContext, true);
            if (!m_context && m_shareContext) {
                // re-try without a shared glx context
                m_context = glXCreateNewContext(m_display, config, GLX_RGBA_TYPE, nullptr, true);
                if (m_context)
                    m_shareContext = nullptr;
            }
        }

        // Get the basic surface format details
        if (m_context)
            qglx_surfaceFormatFromGLXFBConfig(&m_format, m_display, config);

        // Create a temporary window so that we can make the new context current
        window = createDummyWindow(m_display, config, screen->screenNumber(), screen->root());
    } else {
        // requesting an OpenGL ES context requires glXCreateContextAttribsARB, so bail out
        if (m_format.renderableType() == QSurfaceFormat::OpenGLES)
            return;

        // Note that m_format gets updated with the used surface format
        visualInfo = qglx_findVisualInfo(m_display, screen->screenNumber(), &m_format);
        if (Q_UNLIKELY(!visualInfo))
            qFatal("Could not initialize GLX");
        m_context = glXCreateContext(m_display, visualInfo, m_shareContext, true);
        if (!m_context && m_shareContext) {
            // re-try without a shared glx context
            m_shareContext = nullptr;
            m_context = glXCreateContext(m_display, visualInfo, nullptr, true);
        }

        // Create a temporary window so that we can make the new context current
        window = createDummyWindow(m_display, visualInfo, screen->screenNumber(), screen->root());
        XFree(visualInfo);
    }

    // Query the OpenGL version and profile
    if (m_context && window) {
        GLXContext prevContext = glXGetCurrentContext();
        GLXDrawable prevDrawable = glXGetCurrentDrawable();
        glXMakeCurrent(m_display, window, m_context);
        updateFormatFromContext(m_format);

        // Make our context non-current
        glXMakeCurrent(m_display, prevDrawable, prevContext);
    }

    // Destroy our temporary window
    XDestroyWindow(m_display, window);
}